

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VDotProd(N_Vector X,N_Vector Y,sunindextype param_3,int myid)

{
  int iVar1;
  long lVar2;
  double dVar3;
  undefined8 uVar4;
  double dVar5;
  
  lVar2 = N_VGetLength();
  N_VConst(0x4000000000000000,X);
  N_VConst(0x3fe0000000000000,Y);
  dVar3 = get_time();
  uVar4 = N_VDotProd(X,Y);
  sync_device(X);
  dVar5 = get_time();
  iVar1 = SUNRCompare(uVar4,(double)lVar2);
  if (iVar1 == 0) {
    iVar1 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VDotProd ");
      iVar1 = 0;
    }
  }
  else {
    printf(">>> FAILED test -- N_VDotProd, Proc %d \n",(ulong)(uint)myid);
    iVar1 = 1;
  }
  max_time(X,dVar5 - dVar3);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VDotProd");
  }
  return iVar1;
}

Assistant:

int Test_N_VDotProd(N_Vector X, N_Vector Y, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunindextype global_length;
  sunrealtype ans;

  /* get global length */
  global_length = N_VGetLength(X);

  /* fill vector data */
  N_VConst(TWO, X);
  N_VConst(HALF, Y);

  start_time = get_time();
  ans        = N_VDotProd(X, Y);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal global vector length */
  failure = SUNRCompare(ans, (sunrealtype)global_length);

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProd, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VDotProd \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProd", maxt);

  return (fails);
}